

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfProperties.c
# Opt level: O3

sbfKeyValue sbfProperties_filterV(sbfKeyValue table,char *fmt,...)

{
  char in_AL;
  sbfKeyValue psVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *prefix;
  va_list ap;
  char *local_f0;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  local_e8.overflow_arg_area = &prefix;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  sbfMemory_vasprintf(&local_f0,fmt,&local_e8);
  psVar1 = sbfProperties_filter(table,local_f0);
  free(local_f0);
  return psVar1;
}

Assistant:

sbfKeyValue
sbfProperties_filterV (sbfKeyValue table, const char* fmt, ...)
{
    sbfKeyValue new;
    va_list     ap;
    char*       prefix;

    va_start (ap, fmt);
    xvasprintf (&prefix, fmt, ap);
    va_end (ap);

    new = sbfProperties_filter (table, prefix);

    free (prefix);
    return new;
}